

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_node_edges(DG2Dot<dg::LLVMNode> *this,LLVMNode *n,int ind)

{
  ofstream *os;
  uint uVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  Indent Ind;
  Indent local_34;
  
  os = &this->out;
  operator<<((ostream *)os,&local_34);
  poVar2 = std::operator<<((ostream *)os,"/* -- node ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,"\n");
  operator<<(poVar2,&local_34);
  std::operator<<(poVar2," * ------------------------------------------- */\n");
  uVar1 = this->options;
  if ((uVar1 & 4) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* DD edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           dataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
                           .super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   dataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,this->dd_color);
      std::operator<<(poVar2,"\" rank=max]\n");
    }
    uVar1 = this->options;
  }
  if ((uVar1 & 8) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* reverse DD edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           revDataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                           _M_impl.super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revDataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,this->dd_color);
      std::operator<<(poVar2,"\" style=\"dashed\"  constraint=false]\n");
    }
    uVar1 = this->options;
  }
  if ((uVar1 & 0x10) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* USE edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           useEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                           super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).useEdges.
                   super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,this->use_color);
      std::operator<<(poVar2,"\" rank=max style=\"dashed\"]\n");
    }
    uVar1 = this->options;
  }
  if ((uVar1 & 0x20) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* user edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           userEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                           super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).userEdges.
                   super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,this->use_color);
      std::operator<<(poVar2,"\" style=\"dashed\"  constraint=false]\n");
    }
    uVar1 = this->options;
  }
  if ((uVar1 & 0x40) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* CD edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           controlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                           _M_impl.super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   controlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,this->cd_color);
      std::operator<<(poVar2,"\"]\n");
    }
    uVar1 = this->options;
  }
  if ((char)uVar1 < '\0') {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* reverse CD edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           revControlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                           _M_impl.super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revControlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,this->cd_color);
      std::operator<<(poVar2,"\" style=\"dashed\" constraint=false]\n");
    }
    uVar1 = this->options;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* ID edges */\n");
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           interferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t
                           ._M_impl.super__Rb_tree_header + 0x10);
        p_Var3 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   interferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
                   .super__Rb_tree_header._M_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      std::operator<<(poVar2," [color=\"red\" constraint=false]\n");
    }
    uVar1 = this->options;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    operator<<((ostream *)os,&local_34);
    std::operator<<((ostream *)os,"/* reverse ID edges */\n");
    for (p_Var4 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           revInterferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container.
                           _M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var4 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revInterferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                   _M_impl.super__Rb_tree_header._M_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      operator<<((ostream *)os,&local_34);
      poVar2 = std::operator<<((ostream *)os,"NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2," -> NODE");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      std::operator<<(poVar2," [color=\"orange\" constraint=false]\n");
    }
  }
  return;
}

Assistant:

void dump_node_edges(NodeT *n, int ind = 1) {
        Indent Ind(ind);

        out << Ind << "/* -- node " << n->getKey() << "\n"
            << Ind << " * ------------------------------------------- */\n";

        if (options & PRINT_DD) {
            out << Ind << "/* DD edges */\n";
            for (auto II = n->data_begin(), EE = n->data_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << dd_color << "\" rank=max]\n";
        }

        if (options & PRINT_REV_DD) {
            out << Ind << "/* reverse DD edges */\n";
            for (auto II = n->rev_data_begin(), EE = n->rev_data_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << dd_color << "\" style=\"dashed\"  constraint=false]\n";
        }

        if (options & PRINT_USE) {
            out << Ind << "/* USE edges */\n";
            for (auto II = n->use_begin(), EE = n->use_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << use_color << "\" rank=max style=\"dashed\"]\n";
        }

        if (options & PRINT_USER) {
            out << Ind << "/* user edges */\n";
            for (auto II = n->user_begin(), EE = n->user_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << use_color << "\" style=\"dashed\"  constraint=false]\n";
        }

        if (options & PRINT_CD) {
            out << Ind << "/* CD edges */\n";
            for (auto II = n->control_begin(), EE = n->control_end(); II != EE;
                 ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << cd_color << "\"]\n";
        }

        if (options & PRINT_REV_CD) {
            out << Ind << "/* reverse CD edges */\n";
            for (auto II = n->rev_control_begin(), EE = n->rev_control_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << cd_color << "\" style=\"dashed\" constraint=false]\n";
        }

        if (options & PRINT_ID) {
            out << Ind << "/* ID edges */\n";
            for (auto II = n->interference_begin(), EE = n->interference_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II
                    << " [color=\"red\" constraint=false]\n";
        }

        if (options & PRINT_REV_ID) {
            out << Ind << "/* reverse ID edges */\n";
            for (auto II = n->rev_interference_begin(),
                      EE = n->rev_interference_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II
                    << " [color=\"orange\" constraint=false]\n";
        }
    }